

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  ulong uVar1;
  int local_47c;
  byte local_478;
  byte local_477;
  byte abStack_476 [6];
  uchar buf [1024];
  byte local_6a;
  byte local_69;
  uchar pad_done;
  byte *pbStack_68;
  uchar bad;
  uchar *p;
  size_t i;
  size_t pad_count;
  size_t ilen;
  int ret;
  uchar *input_local;
  size_t *olen_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  i = 0;
  local_6a = 0;
  if ((mode == 1) && (ctx->padding != 0)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    uVar1 = ctx->len;
    if ((uVar1 < 0x10) || (0x400 < uVar1)) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      if (mode == 0) {
        local_47c = mbedtls_rsa_public(ctx,input,&local_478);
      }
      else {
        local_47c = mbedtls_rsa_private(ctx,f_rng,p_rng,input,&local_478);
      }
      if (local_47c == 0) {
        if (mode == 1) {
          for (p = (uchar *)0x0; p < (uchar *)(uVar1 - 3); p = p + 1) {
            local_6a = local_6a |
                       (byte)((int)((uint)abStack_476[(long)p] | -(uint)abStack_476[(long)p] & 0xff)
                             >> 7) ^ 1;
            i = (long)(int)((int)((uint)local_6a | -(uint)local_6a & 0xff) >> 7 ^ 1) + i;
          }
          pbStack_68 = abStack_476 + i + 1;
          local_69 = local_478 | local_477 ^ 2 | abStack_476[i];
        }
        else {
          for (p = (uchar *)0x0; p < (uchar *)(uVar1 - 3); p = p + 1) {
            local_6a = local_6a | abStack_476[(long)p] != 0xff;
            i = (long)(int)(uint)(local_6a == 0) + i;
          }
          pbStack_68 = abStack_476 + i + 1;
          local_69 = local_478 | local_477 ^ 1 | abStack_476[i];
        }
        if (local_69 == 0 && 7 < i) {
          if (output_max_len < uVar1 - ((long)pbStack_68 - (long)&local_478)) {
            ctx_local._4_4_ = -0x4400;
          }
          else {
            *olen = uVar1 - ((long)pbStack_68 - (long)&local_478);
            memcpy(output,pbStack_68,*olen);
            ctx_local._4_4_ = 0;
          }
        }
        else {
          ctx_local._4_4_ = -0x4100;
        }
      }
      else {
        ctx_local._4_4_ = local_47c;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t *olen,
                                 const unsigned char *input,
                                 unsigned char *output,
                                 size_t output_max_len)
{
    int ret;
    size_t ilen, pad_count = 0, i;
    unsigned char *p, bad, pad_done = 0;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        return( ret );

    p = buf;
    bad = 0;

    /*
     * Check and get padding len in "constant-time"
     */
    bad |= *p++; /* First byte must be 0 */

    /* This test does not depend on secret data */
    if( mode == MBEDTLS_RSA_PRIVATE )
    {
        bad |= *p++ ^ MBEDTLS_RSA_CRYPT;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done  |= ((p[i] | (unsigned char)-p[i]) >> 7) ^ 1;
            pad_count += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }
    else
    {
        bad |= *p++ ^ MBEDTLS_RSA_SIGN;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done |= ( p[i] != 0xFF );
            pad_count += ( pad_done == 0 );
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }

    bad |= ( pad_count < 8 );

    if( bad )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( ilen - ( p - buf ) > output_max_len )
        return( MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE );

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );

    return( 0 );
}